

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetActiveID(ImGuiID id,ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  ImGuiInputSource IVar2;
  bool bVar3;
  
  pIVar1 = GImGui;
  bVar3 = GImGui->ActiveId == id;
  GImGui->ActiveIdIsJustActivated = !bVar3;
  if (bVar3) {
    pIVar1->ActiveIdAllowOverlap = false;
    pIVar1->ActiveIdWindow = window;
    pIVar1->ActiveIdHasBeenEditedThisFrame = false;
    if (id == 0) goto LAB_001112fe;
  }
  else {
    pIVar1->ActiveIdTimer = 0.0;
    pIVar1->ActiveIdHasBeenPressedBefore = false;
    pIVar1->ActiveIdHasBeenEditedBefore = false;
    if (id == 0) {
      pIVar1->ActiveId = 0;
      pIVar1->ActiveIdAllowOverlap = false;
      pIVar1->ActiveIdWindow = window;
      pIVar1->ActiveIdHasBeenEditedThisFrame = false;
      goto LAB_001112fe;
    }
    pIVar1->LastActiveId = id;
    pIVar1->LastActiveIdTimer = 0.0;
    pIVar1->ActiveId = id;
    pIVar1->ActiveIdAllowOverlap = false;
    pIVar1->ActiveIdWindow = window;
    pIVar1->ActiveIdHasBeenEditedThisFrame = false;
  }
  pIVar1->ActiveIdIsAlive = id;
  IVar2 = ImGuiInputSource_Nav;
  if (((pIVar1->NavActivateId != id) && (pIVar1->NavInputId != id)) &&
     (pIVar1->NavJustTabbedId != id)) {
    IVar2 = (pIVar1->NavJustMovedToId == id) + ImGuiInputSource_Mouse;
  }
  pIVar1->ActiveIdSource = IVar2;
LAB_001112fe:
  pIVar1->ActiveIdUsingNavDirMask = 0;
  pIVar1->ActiveIdUsingNavInputMask = 0;
  pIVar1->ActiveIdUsingKeyInputMask = 0;
  return;
}

Assistant:

void ImGui::SetActiveID(ImGuiID id, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    g.ActiveIdIsJustActivated = (g.ActiveId != id);
    if (g.ActiveIdIsJustActivated)
    {
        g.ActiveIdTimer = 0.0f;
        g.ActiveIdHasBeenPressedBefore = false;
        g.ActiveIdHasBeenEditedBefore = false;
        if (id != 0)
        {
            g.LastActiveId = id;
            g.LastActiveIdTimer = 0.0f;
        }
    }
    g.ActiveId = id;
    g.ActiveIdAllowOverlap = false;
    g.ActiveIdWindow = window;
    g.ActiveIdHasBeenEditedThisFrame = false;
    if (id)
    {
        g.ActiveIdIsAlive = id;
        g.ActiveIdSource = (g.NavActivateId == id || g.NavInputId == id || g.NavJustTabbedId == id || g.NavJustMovedToId == id) ? ImGuiInputSource_Nav : ImGuiInputSource_Mouse;
    }

    // Clear declaration of inputs claimed by the widget
    // (Please note that this is WIP and not all keys/inputs are thoroughly declared by all widgets yet)
    g.ActiveIdUsingNavDirMask = 0x00;
    g.ActiveIdUsingNavInputMask = 0x00;
    g.ActiveIdUsingKeyInputMask = 0x00;
}